

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

void __thiscall
icu_63::CollationRuleParser::parseStarredCharacters
          (CollationRuleParser *this,int32_t strength,int32_t i,UErrorCode *errorCode)

{
  uint srcChar;
  short sVar1;
  Sink *pSVar2;
  UnicodeString *this_00;
  bool bVar3;
  char16_t cVar4;
  int32_t iVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  int32_t iVar9;
  uint uVar10;
  char *reason;
  uint uVar11;
  ulong uVar12;
  int local_108;
  UnicodeString raw;
  UnicodeString s;
  UnicodeString empty;
  
  empty.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
  empty.fUnion.fStackFields.fLengthAndFlags = 2;
  raw.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
  raw.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar5 = skipWhiteSpace(this,i);
  local_108 = parseString(this,iVar5,&raw,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((ushort)raw.fUnion.fStackFields.fLengthAndFlags < 0x20) {
      setParseError(this,"missing starred-relation string",errorCode);
    }
    else {
      iVar5 = 0;
      uVar12 = 0xffffffffffffffff;
      do {
        while( true ) {
          uVar6 = raw.fUnion.fFields.fLength;
          if (-1 < raw.fUnion.fStackFields.fLengthAndFlags) {
            uVar6 = (int)raw.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if ((int)uVar6 <= iVar5) break;
          uVar7 = UnicodeString::char32At(&raw,iVar5);
          uVar12 = (ulong)uVar7;
          iVar8 = (*(this->nfd->super_UObject)._vptr_UObject[0x11])(this->nfd,uVar12);
          if ((char)iVar8 == '\0') {
            setParseError(this,"starred-relation string is not all NFD-inert",errorCode);
            goto LAB_0023bd50;
          }
          pSVar2 = this->sink;
          UnicodeString::UnicodeString(&s,uVar7);
          (*(pSVar2->super_UObject)._vptr_UObject[4])
                    (pSVar2,(ulong)(uint)strength,&empty,&s,&empty,&this->errorReason,errorCode);
          UnicodeString::~UnicodeString(&s);
          if (U_ZERO_ERROR < *errorCode) {
            setErrorContext(this);
            goto LAB_0023bd50;
          }
          iVar5 = (iVar5 - (uint)(uVar7 < 0x10000)) + 2;
        }
        this_00 = this->rules;
        sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar9 = (this_00->fUnion).fFields.fLength;
        }
        else {
          iVar9 = (int)sVar1 >> 5;
        }
        if ((iVar9 <= local_108) ||
           (cVar4 = UnicodeString::doCharAt(this_00,local_108), cVar4 != L'-')) {
          iVar5 = skipWhiteSpace(this,local_108);
          this->ruleIndex = iVar5;
          break;
        }
        iVar8 = (int)uVar12;
        if (iVar8 < 0) {
          reason = "range without start in starred-relation string";
LAB_0023bd9a:
          setParseError(this,reason,errorCode);
          break;
        }
        local_108 = parseString(this,local_108 + 1,&raw,errorCode);
        if (U_ZERO_ERROR < *errorCode) break;
        if ((ushort)raw.fUnion.fStackFields.fLengthAndFlags < 0x20) {
          reason = "range without end in starred-relation string";
          goto LAB_0023bd9a;
        }
        uVar7 = UnicodeString::char32At(&raw,0);
        if ((int)uVar7 < iVar8) {
          setParseError(this,"range start greater than end in starred-relation string",errorCode);
          break;
        }
        s.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
        s.fUnion.fStackFields.fLengthAndFlags = 2;
        uVar10 = -iVar8;
        uVar11 = iVar8 - 0xfffc;
        do {
          if (uVar7 + uVar10 == 0) {
            iVar5 = 2 - (uint)(uVar7 < 0x10000);
            bVar3 = false;
            uVar12 = 0xffffffffffffffff;
            goto LAB_0023bd08;
          }
          srcChar = uVar11 + 0xfffd;
          uVar12 = (ulong)srcChar;
          iVar8 = (*(this->nfd->super_UObject)._vptr_UObject[0x11])(this->nfd,uVar12);
          if ((char)iVar8 == '\0') {
            bVar3 = (int)-uVar10 < (int)uVar7;
            setParseError(this,"starred-relation string range is not all NFD-inert",errorCode);
            goto LAB_0023bd08;
          }
          if ((srcChar & 0x7ffff800) == 0xd800) {
            bVar3 = (int)-uVar10 < (int)uVar7;
            setParseError(this,"starred-relation string range contains a surrogate",errorCode);
            goto LAB_0023bd08;
          }
          if (uVar11 < 3) {
            bVar3 = (int)-uVar10 < (int)uVar7;
            setParseError(this,"starred-relation string range contains U+FFFD, U+FFFE or U+FFFF",
                          errorCode);
            goto LAB_0023bd08;
          }
          UnicodeString::setTo(&s,srcChar);
          (*(this->sink->super_UObject)._vptr_UObject[4])
                    (this->sink,(ulong)(uint)strength,&empty,&s,&empty,&this->errorReason,errorCode)
          ;
          uVar10 = uVar10 - 1;
          uVar11 = uVar11 + 1;
        } while (*errorCode < U_ILLEGAL_ARGUMENT_ERROR);
        bVar3 = (int)~uVar10 < (int)uVar7;
        setErrorContext(this);
LAB_0023bd08:
        UnicodeString::~UnicodeString(&s);
      } while (!bVar3);
    }
  }
LAB_0023bd50:
  UnicodeString::~UnicodeString(&raw);
  UnicodeString::~UnicodeString(&empty);
  return;
}

Assistant:

void
CollationRuleParser::parseStarredCharacters(int32_t strength, int32_t i, UErrorCode &errorCode) {
    UnicodeString empty, raw;
    i = parseString(skipWhiteSpace(i), raw, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(raw.isEmpty()) {
        setParseError("missing starred-relation string", errorCode);
        return;
    }
    UChar32 prev = -1;
    int32_t j = 0;
    for(;;) {
        while(j < raw.length()) {
            UChar32 c = raw.char32At(j);
            if(!nfd.isInert(c)) {
                setParseError("starred-relation string is not all NFD-inert", errorCode);
                return;
            }
            sink->addRelation(strength, empty, UnicodeString(c), empty, errorReason, errorCode);
            if(U_FAILURE(errorCode)) {
                setErrorContext();
                return;
            }
            j += U16_LENGTH(c);
            prev = c;
        }
        if(i >= rules->length() || rules->charAt(i) != 0x2d) {  // '-'
            break;
        }
        if(prev < 0) {
            setParseError("range without start in starred-relation string", errorCode);
            return;
        }
        i = parseString(i + 1, raw, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(raw.isEmpty()) {
            setParseError("range without end in starred-relation string", errorCode);
            return;
        }
        UChar32 c = raw.char32At(0);
        if(c < prev) {
            setParseError("range start greater than end in starred-relation string", errorCode);
            return;
        }
        // range prev-c
        UnicodeString s;
        while(++prev <= c) {
            if(!nfd.isInert(prev)) {
                setParseError("starred-relation string range is not all NFD-inert", errorCode);
                return;
            }
            if(U_IS_SURROGATE(prev)) {
                setParseError("starred-relation string range contains a surrogate", errorCode);
                return;
            }
            if(0xfffd <= prev && prev <= 0xffff) {
                setParseError("starred-relation string range contains U+FFFD, U+FFFE or U+FFFF", errorCode);
                return;
            }
            s.setTo(prev);
            sink->addRelation(strength, empty, s, empty, errorReason, errorCode);
            if(U_FAILURE(errorCode)) {
                setErrorContext();
                return;
            }
        }
        prev = -1;
        j = U16_LENGTH(c);
    }
    ruleIndex = skipWhiteSpace(i);
}